

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O3

BGZF * bgzf_read_init(hFILE *hfpr)

{
  ssize_t sVar1;
  BGZF *pBVar2;
  void *pvVar3;
  uint uVar4;
  uint8_t magic [18];
  char local_48;
  char local_47;
  byte local_45;
  int local_3c;
  
  sVar1 = hpeek(hfpr,&local_48,0x12);
  if (-1 < sVar1) {
    pBVar2 = (BGZF *)calloc(1,0x60);
    uVar4 = 0;
    if (pBVar2 != (BGZF *)0x0) {
      pvVar3 = malloc(0x10000);
      pBVar2->uncompressed_block = pvVar3;
      pvVar3 = malloc(0x10000);
      pBVar2->compressed_block = pvVar3;
      if (((sVar1 == 0x12 && local_48 == '\x1f') && local_47 == -0x75) &&
         (uVar4 = 0x80000000, (local_45 & 4) != 0)) {
        uVar4 = (uint)(local_3c != 0x24342) << 0x1f;
      }
      *(uint *)pBVar2 =
           uVar4 | (uint)((sVar1 == 0x12 && local_48 == '\x1f') && local_47 == -0x75) << 0x1d;
      pvVar3 = calloc(1,0x28);
      pBVar2->cache = pvVar3;
      return pBVar2;
    }
  }
  return (BGZF *)0x0;
}

Assistant:

static BGZF *bgzf_read_init(hFILE *hfpr)
{
    BGZF *fp;
    uint8_t magic[18];
    ssize_t n = hpeek(hfpr, magic, 18);
    if (n < 0) return NULL;

    fp = (BGZF*)calloc(1, sizeof(BGZF));
    if (fp == NULL) return NULL;

    fp->is_write = 0;
    fp->is_compressed = (n==2 && magic[0]==0x1f && magic[1]==0x8b);
    fp->uncompressed_block = malloc(BGZF_MAX_BLOCK_SIZE);
    fp->compressed_block = malloc(BGZF_MAX_BLOCK_SIZE);
    fp->is_compressed = (n==18 && magic[0]==0x1f && magic[1]==0x8b) ? 1 : 0;
    fp->is_gzip = ( !fp->is_compressed || ((magic[3]&4) && memcmp(&magic[12], "BC\2\0",4)==0) ) ? 0 : 1;
#ifdef BGZF_CACHE
    fp->cache = kh_init(cache);
#endif
    return fp;
}